

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibUtil.c
# Opt level: O1

SC_WireLoad * Abc_SclFetchWireLoadModel(SC_Lib *p,char *pWLoadUsed)

{
  uint uVar1;
  void **ppvVar2;
  int iVar3;
  ulong uVar4;
  SC_WireLoad *pSVar5;
  
  if (pWLoadUsed == (char *)0x0) {
    __assert_fail("pWLoadUsed != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclLibUtil.c"
                  ,0x170,"SC_WireLoad *Abc_SclFetchWireLoadModel(SC_Lib *, char *)");
  }
  uVar1 = (p->vWireLoads).nSize;
  if ((int)uVar1 < 1) {
    uVar4 = 0;
    pSVar5 = (SC_WireLoad *)0x0;
  }
  else {
    ppvVar2 = (p->vWireLoads).pArray;
    uVar4 = 0;
    do {
      pSVar5 = (SC_WireLoad *)ppvVar2[uVar4];
      p = (SC_Lib *)pSVar5->pName;
      iVar3 = strcmp((char *)p,pWLoadUsed);
      if (iVar3 == 0) goto LAB_0046eb01;
      uVar4 = uVar4 + 1;
    } while (uVar1 != uVar4);
    uVar4 = (ulong)uVar1;
  }
LAB_0046eb01:
  if ((uint)uVar4 != uVar1) {
    return pSVar5;
  }
  Abc_Print((int)p,"Cannot find wire load model \"%s\".\n",pWLoadUsed);
  exit(1);
}

Assistant:

SC_WireLoad * Abc_SclFetchWireLoadModel( SC_Lib * p, char * pWLoadUsed )
{
    SC_WireLoad * pWL = NULL;
    int i;
    // Get the actual table and reformat it for 'wire_cap' output:
    assert( pWLoadUsed != NULL );
    SC_LibForEachWireLoad( p, pWL, i )
        if ( !strcmp(pWL->pName, pWLoadUsed) )
            break;
    if ( i == Vec_PtrSize(&p->vWireLoads) )
    {
        Abc_Print( -1, "Cannot find wire load model \"%s\".\n", pWLoadUsed );
        exit(1);
    }
//    printf( "Using wireload model \"%s\".\n", pWL->pName );
    return pWL;
}